

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall flatbuffers::Registry::AddIncludeDirectory(Registry *this,char *path)

{
  char *local_18;
  char *path_local;
  Registry *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            (&this->include_paths_,&local_18);
  return;
}

Assistant:

void AddIncludeDirectory(const char *path) { include_paths_.push_back(path); }